

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

alpnid alpn2alpnid(char *name)

{
  int iVar1;
  char *name_local;
  
  iVar1 = curl_strequal(name,"h1");
  if (iVar1 == 0) {
    iVar1 = curl_strequal(name,"h2");
    if (iVar1 == 0) {
      iVar1 = curl_strequal(name,"h3");
      if (iVar1 == 0) {
        name_local._4_4_ = ALPN_none;
      }
      else {
        name_local._4_4_ = ALPN_h3;
      }
    }
    else {
      name_local._4_4_ = ALPN_h2;
    }
  }
  else {
    name_local._4_4_ = ALPN_h1;
  }
  return name_local._4_4_;
}

Assistant:

static enum alpnid alpn2alpnid(char *name)
{
  if(strcasecompare(name, "h1"))
    return ALPN_h1;
  if(strcasecompare(name, "h2"))
    return ALPN_h2;
  if(strcasecompare(name, H3VERSION))
    return ALPN_h3;
  return ALPN_none; /* unknown, probably rubbish input */
}